

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

void dlep_extension_add(dlep_extension *ext)

{
  list_entity *plVar1;
  uint16_t uVar2;
  uint16_t *puVar3;
  bool bVar4;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  uint16_t *ptr;
  dlep_extension *ext_local;
  
  bVar4 = false;
  if ((ext->_node).list.next != (list_entity *)0x0) {
    bVar4 = (ext->_node).list.prev != (list_entity *)0x0;
  }
  if (!bVar4) {
    (ext->_node).key = ext;
    avl_insert(&_extension_tree,&ext->_node);
    puVar3 = (uint16_t *)realloc(_id_array,(ulong)_extension_tree.count << 1);
    if (puVar3 != (uint16_t *)0x0) {
      _id_array_length = 0;
      _id_array = puVar3;
      for (plVar1 = _extension_tree.list_head.next; ptr = (uint16_t *)(plVar1 + -9),
          plVar1->prev != _extension_tree.list_head.prev; plVar1 = plVar1->next) {
        if ((-1 < *(int *)ptr) && (*(int *)ptr < 0x10000)) {
          uVar2 = htons((uint16_t)*(undefined4 *)ptr);
          puVar3[_id_array_length] = uVar2;
          _id_array_length = _id_array_length + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void
dlep_extension_add(struct dlep_extension *ext) {
  uint16_t *ptr;

  if (avl_is_node_added(&ext->_node)) {
    return;
  }

  /* add to tree */
  ext->_node.key = &ext->id;
  avl_insert(&_extension_tree, &ext->_node);

  /* refresh id array */
  ptr = realloc(_id_array, sizeof(uint16_t) * _extension_tree.count);
  if (!ptr) {
    return;
  }

  _id_array_length = 0;
  _id_array = ptr;

  avl_for_each_element(&_extension_tree, ext, _node) {
    if (ext->id >= 0 && ext->id <= 0xffff) {
      ptr[_id_array_length] = htons(ext->id);
      _id_array_length++;
    }
  }
}